

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O0

feed_db_status_t store_feed_info_db(feed_info_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char local_f8 [8];
  char qr [196];
  sqlite3_stmt *local_28;
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  feed_info_t *record_local;
  
  stmt = (sqlite3_stmt *)db;
  db_local = (feed_db_t *)record;
  memcpy(local_f8,
         "INSERT INTO feed_info (feed_publisher_name, feed_publisher_url, feed_lang,feed_start_date, feed_end_date, feed_version,feed_contact_email, feed_contact_url) values (?1, ?2, ?3,?4, ?5, ?6,?7, ?8);"
         ,0xc4);
  sqlite3_prepare_v2(*(sqlite3 **)(stmt + 8),local_f8,-1,&local_28,(char **)0x0);
  sqlite3_bind_text(local_28,1,(char *)db_local,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,2,(char *)&db_local[1].rc,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,3,(char *)&db_local[4].in_transaction,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,4,(char *)&db_local[6].error_msg,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,5,(char *)((long)&db_local[6].rc + 1),-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,6,(char *)((long)&db_local[6].in_transaction + 2),-1,
                    (_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,7,(char *)((long)&db_local[8].error_msg + 2),-1,
                    (_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,8,(char *)((long)&db_local[10].path + 2),-1,(_func_void_void_ptr *)0x0)
  ;
  iVar1 = sqlite3_step(local_28);
  *(int *)(stmt + 0x18) = iVar1;
  iVar1 = *(int *)(stmt + 0x18);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_28);
  }
  else {
    pcVar2 = sqlite3_errmsg(*(sqlite3 **)(stmt + 8));
    pcVar2 = strdup(pcVar2);
    *(char **)(stmt + 0x10) = pcVar2;
    sqlite3_finalize(local_28);
  }
  record_local._4_4_ = (feed_db_status_t)(iVar1 == 0x65);
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_feed_info_db(feed_info_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO feed_info ("
                    "feed_publisher_name, feed_publisher_url, feed_lang,"
                    "feed_start_date, feed_end_date, feed_version,"
                    "feed_contact_email, feed_contact_url"
                ") values ("
                    "?1, ?2, ?3,"
                    "?4, ?5, ?6,"
                    "?7, ?8"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->feed_publisher_name, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->feed_publisher_url, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->feed_lang, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->feed_start_date, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->feed_end_date, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 6, record->feed_version, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 7, record->feed_contact_email, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 8, record->feed_contact_url, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}